

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfasttext.cc
# Opt level: O0

fasttext_tokens_t * cft_fasttext_tokenize(fasttext_t *handle,char *text)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  size_type sVar4;
  fasttext_tokens_t *pfVar5;
  char **ppcVar6;
  char *pcVar7;
  string *in_RSI;
  size_t i;
  char **tokens;
  fasttext_tokens_t *ret;
  size_t len;
  string token;
  stringstream ioss;
  shared_ptr<const_fasttext::Dictionary> d;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  text_split;
  FastText *in_stack_fffffffffffffda8;
  string *word;
  allocator *in;
  Dictionary *in_stack_fffffffffffffdc8;
  size_type __n;
  string local_218 [39];
  allocator local_1f1;
  string local_1f0 [32];
  stringstream local_1d0 [424];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  string *local_10;
  
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x18fed4);
  fasttext::FastText::getDictionary(in_stack_fffffffffffffda8);
  in = &local_1f1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f0,(char *)local_10,in);
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1d0,local_1f0,_Var3);
  std::__cxx11::string::~string(local_1f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f1);
  std::__cxx11::string::string(local_218);
  word = local_10;
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    while( true ) {
      std::__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<const_fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x18ffa5);
      bVar2 = fasttext::Dictionary::readWord(in_stack_fffffffffffffdc8,(istream *)in,word);
      if (!bVar2) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in,word);
    }
  }
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_28);
  pfVar5 = (fasttext_tokens_t *)malloc(0x10);
  pfVar5->length = sVar4;
  ppcVar6 = (char **)malloc(sVar4 << 3);
  for (__n = 0; __n < sVar4; __n = __n + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&local_28,__n);
    pcVar7 = (char *)std::__cxx11::string::c_str();
    pcVar7 = strdup(pcVar7);
    ppcVar6[__n] = pcVar7;
  }
  pfVar5->tokens = ppcVar6;
  std::__cxx11::string::~string(local_218);
  std::__cxx11::stringstream::~stringstream(local_1d0);
  std::shared_ptr<const_fasttext::Dictionary>::~shared_ptr
            ((shared_ptr<const_fasttext::Dictionary> *)0x190148);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in);
  return pfVar5;
}

Assistant:

fasttext_tokens_t* cft_fasttext_tokenize(fasttext_t* handle, const char* text) {
    std::vector<std::string> text_split;
    std::shared_ptr<const fasttext::Dictionary> d = ((FastText*)handle)->getDictionary();
    std::stringstream ioss(text);
    std::string token;
    while (!ioss.eof()) {
        while (d->readWord(ioss, token)) {
        text_split.push_back(token);
        }
    }
    size_t len = text_split.size();
    fasttext_tokens_t* ret = static_cast<fasttext_tokens_t*>(malloc(sizeof(fasttext_tokens_t)));
    ret->length = len;
    char** tokens = static_cast<char**>(malloc(sizeof(char*) * len));
    for (size_t i = 0; i < len; i++) {
        tokens[i] = strdup(text_split[i].c_str());
    }
    ret->tokens = tokens;
    return ret;
}